

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

container_t *
convert_to_bitset_or_array_container(run_container_t *rc,int32_t card,uint8_t *resulttype)

{
  ushort uVar1;
  int iVar2;
  rle16_t *prVar3;
  uint16_t *puVar4;
  uint8_t uVar5;
  array_container_t *paVar6;
  long lVar7;
  ushort uVar8;
  ushort uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ushort *puVar13;
  uint uVar14;
  
  if (card < 0x1001) {
    paVar6 = array_container_create_given_capacity(card);
    paVar6->cardinality = 0;
    iVar2 = rc->n_runs;
    if (0 < (long)iVar2) {
      prVar3 = rc->runs;
      lVar7 = 0;
      do {
        uVar8 = prVar3[lVar7].value;
        uVar1 = prVar3[lVar7].length;
        uVar9 = uVar1 + uVar8;
        if (!CARRY2(uVar1,uVar8)) {
          uVar12 = (ulong)paVar6->cardinality;
          puVar13 = paVar6->array + uVar12;
          do {
            *puVar13 = uVar8;
            uVar8 = uVar8 + 1;
            puVar13 = puVar13 + 1;
            uVar11 = (int)uVar12 + 1;
            uVar12 = (ulong)uVar11;
          } while (uVar8 <= uVar9);
          paVar6->cardinality = uVar11;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != iVar2);
    }
    uVar5 = '\x02';
    if (paVar6->cardinality != card) {
      __assert_fail("card == answer->cardinality",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x2de6,
                    "container_t *convert_to_bitset_or_array_container(run_container_t *, int32_t, uint8_t *)"
                   );
    }
  }
  else {
    paVar6 = (array_container_t *)bitset_container_create();
    iVar2 = rc->n_runs;
    if (0 < (long)iVar2) {
      prVar3 = rc->runs;
      puVar4 = paVar6->array;
      lVar7 = 0;
      do {
        uVar8 = prVar3[lVar7].value;
        uVar1 = prVar3[lVar7].length;
        uVar14 = (uint)uVar1 + (uint)uVar8;
        uVar11 = (uint)(uVar8 >> 6);
        uVar10 = uVar14 >> 6;
        if (uVar10 - uVar11 == 0) {
          *(ulong *)(puVar4 + (ulong)uVar11 * 4) =
               *(ulong *)(puVar4 + (ulong)uVar11 * 4) |
               (0xffffffffffffffffU >> (0x3fU - (char)uVar1 & 0x3f)) << ((byte)uVar8 & 0x3f);
        }
        else {
          uVar12 = *(ulong *)(puVar4 + (ulong)uVar10 * 4);
          *(ulong *)(puVar4 + (ulong)uVar11 * 4) =
               *(ulong *)(puVar4 + (ulong)uVar11 * 4) | -1L << ((byte)uVar8 & 0x3f);
          if (uVar11 + 1 < uVar10) {
            memset(puVar4 + (ulong)(uVar8 >> 6) * 4 + 4,0xff,
                   (ulong)((uVar10 - uVar11) - 2 >> 1) * 0x10 + 0x10);
          }
          *(ulong *)(puVar4 + (ulong)uVar10 * 4) =
               uVar12 | 0xffffffffffffffffU >> (~(byte)uVar14 & 0x3f);
        }
        lVar7 = lVar7 + 1;
      } while (iVar2 != lVar7);
    }
    paVar6->cardinality = card;
    uVar5 = '\x01';
  }
  *resulttype = uVar5;
  return paVar6;
}

Assistant:

container_t *convert_to_bitset_or_array_container(
    run_container_t *rc, int32_t card,
    uint8_t *resulttype
){
    if (card <= DEFAULT_MAX_SIZE) {
        array_container_t *answer = array_container_create_given_capacity(card);
        answer->cardinality = 0;
        for (int rlepos = 0; rlepos < rc->n_runs; ++rlepos) {
            uint16_t run_start = rc->runs[rlepos].value;
            uint16_t run_end = run_start + rc->runs[rlepos].length;
            for (uint16_t run_value = run_start; run_value <= run_end;
                 ++run_value) {
                answer->array[answer->cardinality++] = run_value;
            }
        }
        assert(card == answer->cardinality);
        *resulttype = ARRAY_CONTAINER_TYPE;
        //run_container_free(r);
        return answer;
    }
    bitset_container_t *answer = bitset_container_create();
    for (int rlepos = 0; rlepos < rc->n_runs; ++rlepos) {
        uint16_t run_start = rc->runs[rlepos].value;
        bitset_set_lenrange(answer->words, run_start, rc->runs[rlepos].length);
    }
    answer->cardinality = card;
    *resulttype = BITSET_CONTAINER_TYPE;
    //run_container_free(r);
    return answer;
}